

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

ON_Hatch *
ON_Hatch::HatchFromBrep
          (ON_Hatch *use_this_hatch,ON_Brep *brep,int face_index,int pattern_index,
          double pattern_rotation_radians,double pattern_scale,ON_3dPoint basepoint)

{
  ON_PolyCurve *pOVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int capacity;
  ON_Curve **ppOVar5;
  ON_PolyCurve *this;
  ON_HatchLoop *this_00;
  ON_HatchLoop **sz;
  ON_HatchLoop *hloop;
  ON_Xform xf;
  ON_Curve *ec_1;
  int ei;
  ON_PolyCurve *pc;
  ON_Curve *pOStack_150;
  int edgecount;
  ON_Curve *ec;
  ON_Curve *edgecurve;
  ON_BrepTrim *trim;
  int ti;
  int trimcount;
  ON_BrepLoop *loop;
  ON_SimpleArray<ON_Curve_*> edgecurves;
  ON_Curve *loopcurve;
  int li;
  int loopcount;
  bool rc;
  undefined1 local_c8 [8];
  ON_Plane plane;
  ON_BrepFace *face;
  ON_Hatch *newhatch;
  double pattern_scale_local;
  double pattern_rotation_radians_local;
  int pattern_index_local;
  int face_index_local;
  ON_Brep *brep_local;
  ON_Hatch *use_this_hatch_local;
  
  if (use_this_hatch != (ON_Hatch *)0x0) {
    Internal_Destroy(use_this_hatch);
  }
  if (brep == (ON_Brep *)0x0) {
    use_this_hatch_local = (ON_Hatch *)0x0;
  }
  else {
    if ((face_index < 0) ||
       (iVar4 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F),
       pattern_rotation_radians_local._4_4_ = face_index, iVar4 <= face_index)) {
      pattern_rotation_radians_local._4_4_ = 0;
    }
    plane.plane_equation.d = (double)ON_Brep::Face(brep,pattern_rotation_radians_local._4_4_);
    if ((ON_BrepFace *)plane.plane_equation.d == (ON_BrepFace *)0x0) {
      use_this_hatch_local = (ON_Hatch *)0x0;
    }
    else {
      ON_Plane::ON_Plane((ON_Plane *)local_c8);
      bVar2 = (**(code **)(*(long *)plane.plane_equation.d + 0x178))
                        (0,plane.plane_equation.d,(ON_Plane *)local_c8);
      if ((bVar2 & 1) == 0) {
        use_this_hatch_local = (ON_Hatch *)0x0;
      }
      else {
        if (use_this_hatch == (ON_Hatch *)0x0) {
          face = (ON_BrepFace *)operator_new(0xd0);
          face->m_reserved0 = (void *)0x0;
          face->m_reserved1 = (void *)0x0;
          ((ON_SimpleArray<ON_HatchLoop_*> *)&face->field_0xb0)->_vptr_ON_SimpleArray =
               (_func_int **)0x0;
          face->m_pImpl = (Impl *)0x0;
          ((ON_2dPoint *)&face->field_0xa0)->x = 0.0;
          *(double *)&face->field_0xa8 = 0.0;
          (face->m_bbox).m_max.z = 0.0;
          *(double *)&face->field_0x98 = 0.0;
          (face->m_bbox).m_max.x = 0.0;
          (face->m_bbox).m_max.y = 0.0;
          (face->m_bbox).m_min.y = 0.0;
          (face->m_bbox).m_min.z = 0.0;
          *(undefined8 *)((face->m_face_uuid).Data4 + 4) = 0;
          (face->m_bbox).m_min.x = 0.0;
          *(double *)&face->m_face_material_channel = 0.0;
          (face->m_face_uuid).Data2 = 0;
          (face->m_face_uuid).Data3 = 0;
          (face->m_face_uuid).Data4[0] = '\0';
          (face->m_face_uuid).Data4[1] = '\0';
          (face->m_face_uuid).Data4[2] = '\0';
          (face->m_face_uuid).Data4[3] = '\0';
          (face->m_li).m_count = 0;
          (face->m_li).m_capacity = 0;
          *(double *)&face->m_si = 0.0;
          (face->m_li)._vptr_ON_SimpleArray = (_func_int **)0x0;
          (face->m_li).m_a = (int *)0x0;
          (face->m_face_user).h = 0;
          ((ON_3dVector *)&face->m_status)->x = 0.0;
          (((ON_Plane *)&(face->super_ON_SurfaceProxy).m_surface)->origin).x = 0.0;
          *(double *)&(face->super_ON_SurfaceProxy).m_bTransposed = 0.0;
          ((ON_Object *)&(face->super_ON_SurfaceProxy).super_ON_Surface)->_vptr_ON_Object =
               (_func_int **)0x0;
          ((ON_Object *)&(face->super_ON_SurfaceProxy).super_ON_Surface)->m_userdata_list =
               (ON_UserData *)0x0;
          ON_Hatch((ON_Hatch *)face);
        }
        else {
          Internal_Destroy(use_this_hatch);
          face = (ON_BrepFace *)use_this_hatch;
        }
        pattern_rotation_radians_local._0_4_ = pattern_index;
        if (pattern_index < 0) {
          pattern_rotation_radians_local._0_4_ = 0;
        }
        newhatch = (ON_Hatch *)pattern_scale;
        if (pattern_scale < 1.490116119385e-08) {
          newhatch = (ON_Hatch *)0x3ff0000000000000;
        }
        bVar3 = ON_3dPoint::operator==(&ON_3dPoint::UnsetPoint,&basepoint);
        if (bVar3) {
          basepoint.x = ON_3dPoint::Origin.x;
        }
        SetPlane((ON_Hatch *)face,(ON_Plane *)local_c8);
        SetPatternIndex((ON_Hatch *)face,pattern_rotation_radians_local._0_4_);
        SetPatternRotation((ON_Hatch *)face,pattern_rotation_radians);
        SetPatternScale((ON_Hatch *)face,(double)newhatch);
        SetBasePoint((ON_Hatch *)face,basepoint);
        bVar3 = false;
        iVar4 = ON_BrepFace::LoopCount((ON_BrepFace *)plane.plane_equation.d);
        for (loopcurve._4_4_ = 0; loopcurve._4_4_ < iVar4; loopcurve._4_4_ = loopcurve._4_4_ + 1) {
          edgecurves.m_count = 0;
          edgecurves.m_capacity = 0;
          ON_SimpleArray<ON_Curve_*>::ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&loop);
          _ti = ON_BrepFace::Loop((ON_BrepFace *)plane.plane_equation.d,loopcurve._4_4_);
          if (_ti != (ON_BrepLoop *)0x0) {
            trim._4_4_ = ON_BrepLoop::TrimCount(_ti);
            for (trim._0_4_ = 0; (int)trim < trim._4_4_; trim._0_4_ = (int)trim + 1) {
              edgecurve = (ON_Curve *)ON_BrepLoop::Trim(_ti,(int)trim);
              if (((ON_BrepTrim *)edgecurve != (ON_BrepTrim *)0x0) &&
                 (ec = ON_BrepTrim::EdgeCurveOf((ON_BrepTrim *)edgecurve), ec != (ON_Curve *)0x0)) {
                pOStack_150 = ON_Curve::Duplicate(ec);
                if (((ulong)edgecurve[6].super_ON_Geometry.super_ON_Object._vptr_ON_Object & 1) != 0
                   ) {
                  (*(pOStack_150->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])();
                }
                ON_SimpleArray<ON_Curve_*>::Append
                          ((ON_SimpleArray<ON_Curve_*> *)&loop,&stack0xfffffffffffffeb0);
              }
            }
            capacity = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&loop);
            if (capacity == 1) {
              ppOVar5 = ON_SimpleArray<ON_Curve_*>::operator[]
                                  ((ON_SimpleArray<ON_Curve_*> *)&loop,0);
              pOVar1 = (ON_PolyCurve *)*ppOVar5;
            }
            else {
              pOVar1 = (ON_PolyCurve *)edgecurves._16_8_;
              if (1 < capacity) {
                this = (ON_PolyCurve *)operator_new(0x40);
                ON_PolyCurve::ON_PolyCurve(this,capacity);
                pOVar1 = (ON_PolyCurve *)edgecurves._16_8_;
                if (this != (ON_PolyCurve *)0x0) {
                  for (ec_1._4_4_ = 0; pOVar1 = this, ec_1._4_4_ < capacity;
                      ec_1._4_4_ = ec_1._4_4_ + 1) {
                    ppOVar5 = ON_SimpleArray<ON_Curve_*>::operator[]
                                        ((ON_SimpleArray<ON_Curve_*> *)&loop,ec_1._4_4_);
                    xf.m_xform[3][3] = (double)*ppOVar5;
                    if ((ON_Curve *)xf.m_xform[3][3] != (ON_Curve *)0x0) {
                      ON_PolyCurve::AppendAndMatch(this,(ON_Curve *)xf.m_xform[3][3]);
                    }
                  }
                }
              }
            }
            edgecurves._16_8_ = pOVar1;
            if (edgecurves._16_8_ != 0) {
              ON_Xform::ON_Xform((ON_Xform *)&hloop);
              ON_Xform::ChangeBasis((ON_Xform *)&hloop,&ON_xy_plane,(ON_Plane *)local_c8);
              sz = &hloop;
              (**(code **)(*(long *)edgecurves._16_8_ + 0xe0))();
              this_00 = (ON_HatchLoop *)ON_HatchLoop::operator_new((ON_HatchLoop *)0x10,(size_t)sz);
              ON_HatchLoop::ON_HatchLoop(this_00);
              ON_HatchLoop::SetCurve(this_00,(ON_Curve *)edgecurves._16_8_);
              if (_ti->m_type == outer) {
                ON_HatchLoop::SetType(this_00,ltOuter);
                bVar3 = true;
              }
              else {
                ON_HatchLoop::SetType(this_00,ltInner);
              }
              AddLoop((ON_Hatch *)face,this_00);
            }
          }
          ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&loop);
        }
        if ((!bVar3) && (face != (ON_BrepFace *)0x0)) {
          if (face != (ON_BrepFace *)0x0) {
            (*(face->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[4])();
          }
          face = (ON_BrepFace *)0x0;
        }
        use_this_hatch_local = (ON_Hatch *)face;
      }
      ON_Plane::~ON_Plane((ON_Plane *)local_c8);
    }
  }
  return use_this_hatch_local;
}

Assistant:

ON_Hatch* ON_Hatch::HatchFromBrep(
  ON_Hatch* use_this_hatch,
  const ON_Brep* brep,
  int face_index,
  int pattern_index,
  double pattern_rotation_radians,
  double pattern_scale,
  ON_3dPoint basepoint)
{
  ON_Hatch* newhatch = nullptr;
  if (nullptr != use_this_hatch)
    use_this_hatch->Internal_Destroy();

  if (nullptr == brep)
    return nullptr;

  if (face_index < 0 || face_index >= brep->m_F.Count())
    face_index = 0;

  const ON_BrepFace* face = brep->Face(face_index);
  if (nullptr == face)
    return nullptr;

  ON_Plane plane;
  if (!face->IsPlanar(&plane))
    return nullptr;

  if (nullptr == use_this_hatch)
    newhatch = new ON_Hatch();
  else
  {
    newhatch = use_this_hatch;
    newhatch->Internal_Destroy();
  }

  if (0 > pattern_index)
    pattern_index = 0;

  if (pattern_scale < ON_SQRT_EPSILON)
    pattern_scale = 1.0;

  if (ON_3dPoint::UnsetPoint == basepoint)
    basepoint = ON_3dPoint::Origin;

  newhatch->SetPlane(plane);
  newhatch->SetPatternIndex(pattern_index);
  newhatch->SetPatternRotation(pattern_rotation_radians);
  newhatch->SetPatternScale(pattern_scale);
  newhatch->SetBasePoint(basepoint);

  bool rc = false;
  int loopcount = face->LoopCount();
  for (int li = 0; li < loopcount; li++)
  {
    ON_Curve* loopcurve = nullptr;
    ON_SimpleArray< ON_Curve* > edgecurves;
    ON_BrepLoop* loop = face->Loop(li);
    if (nullptr != loop)
    {
      int trimcount = loop->TrimCount();
      for (int ti = 0; ti < trimcount; ti++)
      {
        ON_BrepTrim* trim = loop->Trim(ti);
        if (nullptr != trim)
        {
          const ON_Curve* edgecurve = trim->EdgeCurveOf();
          if (nullptr != edgecurve)
          {
            ON_Curve* ec = edgecurve->Duplicate();
            if (trim->m_bRev3d)
              ec->Reverse();
            edgecurves.Append(ec);
          }
        }
      }

      int edgecount = edgecurves.Count();
      if (edgecount == 1)
      {
        loopcurve = edgecurves[0];
      }
      else if (edgecount > 1)
      {
        ON_PolyCurve* pc = new ON_PolyCurve(edgecount);
        if (nullptr != pc)
        {
          for (int ei = 0; ei < edgecount; ei++)
          {
            ON_Curve* ec = edgecurves[ei];
            if (nullptr != ec)
              pc->AppendAndMatch(ec);
          }
          loopcurve = pc;
        }
      }
      if (nullptr != loopcurve)
      {
        ON_Xform xf;
        xf.ChangeBasis(ON_xy_plane, plane);
        loopcurve->Transform(xf);
        ON_HatchLoop* hloop = new ON_HatchLoop();
        hloop->SetCurve(*loopcurve);
        if(loop->m_type == ON_BrepLoop::TYPE::outer)
        {
          hloop->SetType(ON_HatchLoop::eLoopType::ltOuter);
          rc = true;
        }
        else
          hloop->SetType(ON_HatchLoop::eLoopType::ltInner);
        newhatch->AddLoop(hloop);
      }
    }
  }
  if (!rc)
  {
    if (nullptr != newhatch)
    {
      delete newhatch;
      newhatch = nullptr;
    }
  }

  return newhatch;
}